

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O0

BOOL Internal_ExtractFormatW
               (CPalThread *pthrCurrent,LPCWSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,
               LPINT Precision,LPINT Prefix,LPINT Type)

{
  LPCWSTR pWVar1;
  int iVar2;
  size_t sVar3;
  char *__nptr;
  undefined1 *puVar4;
  LPINT piVar5;
  bool bVar6;
  char *local_58;
  LPSTR TempStrPtr;
  LPSTR TempStr;
  BOOL Result;
  LPINT Precision_local;
  LPINT Width_local;
  LPINT Flags_local;
  LPSTR Out_local;
  LPCWSTR *Fmt_local;
  CPalThread *pthrCurrent_local;
  
  TempStr._4_4_ = 0;
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  if ((*Fmt == (LPCWSTR)0x0) || (**Fmt != L'%')) {
    pthrCurrent_local._4_4_ = 0;
  }
  else {
    pWVar1 = *Fmt;
    *Fmt = pWVar1 + 1;
    Flags_local = (LPINT)(Out + 1);
    *Out = (CHAR)*pWVar1;
    sVar3 = PAL_wcslen(*Fmt);
    __nptr = (char *)CorUnix::InternalMalloc(sVar3 + 1);
    if (__nptr == (char *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CorUnix::CPalThread::SetLastError(8);
      pthrCurrent_local._4_4_ = 0;
    }
    else {
      while( true ) {
        bVar6 = false;
        if ((((**Fmt != L'\0') && (bVar6 = true, **Fmt != L'-')) && (bVar6 = true, **Fmt != L'+'))
           && ((bVar6 = true, **Fmt != L'0' && (bVar6 = true, **Fmt != L' ')))) {
          bVar6 = **Fmt == L'#';
        }
        if (!bVar6) break;
        switch(**Fmt) {
        case L' ':
          *Flags = *Flags | 8;
          break;
        case L'#':
          *Flags = *Flags | 2;
          break;
        case L'+':
          *Flags = *Flags | 0x10;
          break;
        case L'-':
          *Flags = *Flags | 1;
          break;
        case L'0':
          *Flags = *Flags | 4;
        }
        pWVar1 = *Fmt;
        *Fmt = pWVar1 + 1;
        *(char *)Flags_local = (char)*pWVar1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      if (((*Flags & 1U) != 0) && ((*Flags & 4U) != 0)) {
        *Flags = *Flags + -4;
      }
      iVar2 = isdigit((uint)(ushort)**Fmt);
      local_58 = __nptr;
      if (iVar2 == 0) {
        if (**Fmt == L'*') {
          *Width = -2;
          pWVar1 = *Fmt;
          *Fmt = pWVar1 + 1;
          piVar5 = (LPINT)((long)Flags_local + 1);
          *(char *)Flags_local = (char)*pWVar1;
          iVar2 = isdigit((uint)(ushort)**Fmt);
          Flags_local = piVar5;
          if (iVar2 != 0) {
            *Width = -3;
            while (iVar2 = isdigit((uint)(ushort)**Fmt), iVar2 != 0) {
              pWVar1 = *Fmt;
              *Fmt = pWVar1 + 1;
              *(char *)Flags_local = (char)*pWVar1;
              Flags_local = (LPINT)((long)Flags_local + 1);
            }
          }
        }
      }
      else {
        while (iVar2 = isdigit((uint)(ushort)**Fmt), iVar2 != 0) {
          *local_58 = (char)**Fmt;
          pWVar1 = *Fmt;
          *Fmt = pWVar1 + 1;
          *(char *)Flags_local = (char)*pWVar1;
          local_58 = local_58 + 1;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        *local_58 = '\0';
        iVar2 = atoi(__nptr);
        *Width = iVar2;
        if (*Width < 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
            CorUnix::CPalThread::SetLastError(0x54f);
            return 0;
          }
          abort();
        }
      }
      if (**Fmt == L'.') {
        pWVar1 = *Fmt;
        *Fmt = pWVar1 + 1;
        piVar5 = (LPINT)((long)Flags_local + 1);
        *(char *)Flags_local = (char)*pWVar1;
        iVar2 = isdigit((uint)(ushort)**Fmt);
        local_58 = __nptr;
        if (iVar2 == 0) {
          if (**Fmt == L'*') {
            *Precision = -2;
            pWVar1 = *Fmt;
            *Fmt = pWVar1 + 1;
            Flags_local = (LPINT)((long)Flags_local + 2);
            *(char *)piVar5 = (char)*pWVar1;
            iVar2 = isdigit((uint)(ushort)**Fmt);
            if (iVar2 != 0) {
              *Precision = -4;
              while (iVar2 = isdigit((uint)(ushort)**Fmt), iVar2 != 0) {
                pWVar1 = *Fmt;
                *Fmt = pWVar1 + 1;
                *(char *)Flags_local = (char)*pWVar1;
                Flags_local = (LPINT)((long)Flags_local + 1);
              }
            }
          }
          else {
            *Precision = -3;
            Flags_local = piVar5;
          }
        }
        else {
          while (Flags_local = piVar5, iVar2 = isdigit((uint)(ushort)**Fmt), iVar2 != 0) {
            *local_58 = (char)**Fmt;
            pWVar1 = *Fmt;
            *Fmt = pWVar1 + 1;
            *(char *)Flags_local = (char)*pWVar1;
            local_58 = local_58 + 1;
            piVar5 = (LPINT)((long)Flags_local + 1);
          }
          *local_58 = '\0';
          iVar2 = atoi(__nptr);
          *Precision = iVar2;
          if (*Precision < 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
              CorUnix::CPalThread::SetLastError(0x54f);
              return 0;
            }
            abort();
          }
        }
      }
      if (**Fmt == L'p') {
        *Prefix = 3;
      }
      if (**Fmt == L'I') {
        if (((*Fmt)[1] == L'6') && ((*Fmt)[2] == L'4')) {
          *Fmt = *Fmt + 3;
          *Prefix = 3;
        }
        else if (((*Fmt)[1] == L'3') && ((*Fmt)[2] == L'2')) {
          *Fmt = *Fmt + 3;
        }
        else {
          *Fmt = *Fmt + 1;
          *Prefix = 3;
        }
      }
      else if (**Fmt == L'h') {
        *Prefix = 1;
        *Fmt = *Fmt + 1;
      }
      else if ((**Fmt == L'l') || (**Fmt == L'w')) {
        *Fmt = *Fmt + 1;
        if ((**Fmt == L'C') || (**Fmt == L'S')) {
          *Prefix = 4;
        }
        if (**Fmt == L'l') {
          *Prefix = 3;
          *Fmt = *Fmt + 1;
        }
      }
      else if (**Fmt == L'L') {
        *Fmt = *Fmt + 1;
      }
      if ((**Fmt == L'c') || (**Fmt == L'C')) {
        *Type = 1;
        if ((*Prefix != 1) && (**Fmt == L'c')) {
          *Prefix = 2;
        }
        if ((*Prefix == 2) || (*Prefix == 4)) {
          *(undefined1 *)Flags_local = 0x6c;
          *Prefix = 2;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        *(undefined1 *)Flags_local = 99;
        *Fmt = *Fmt + 1;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if ((**Fmt == L's') || (**Fmt == L'S')) {
        if (**Fmt == L'S') {
          *Type = 3;
        }
        else {
          *Type = 2;
        }
        if ((*Prefix != 1) && (**Fmt == L's')) {
          *Prefix = 2;
        }
        if (*Prefix == 2) {
          *(undefined1 *)Flags_local = 0x6c;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        *(undefined1 *)Flags_local = 0x73;
        *Fmt = *Fmt + 1;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if (((((**Fmt == L'd') || (**Fmt == L'i')) || (**Fmt == L'o')) ||
               ((**Fmt == L'u' || (**Fmt == L'x')))) || (**Fmt == L'X')) {
        *Type = 4;
        if (*Prefix == 1) {
          *(undefined1 *)Flags_local = 0x68;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        else if ((*Prefix == 2) || (*Prefix == 4)) {
          *(undefined1 *)Flags_local = 0x6c;
          *Prefix = 2;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        else if (*Prefix == 3) {
          puVar4 = (undefined1 *)((long)Flags_local + 1);
          *(undefined1 *)Flags_local = 0x6c;
          Flags_local = (LPINT)((long)Flags_local + 2);
          *puVar4 = 0x6c;
        }
        pWVar1 = *Fmt;
        *Fmt = pWVar1 + 1;
        *(char *)Flags_local = (char)*pWVar1;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if ((((**Fmt == L'e') || (**Fmt == L'E')) || (**Fmt == L'f')) ||
              ((**Fmt == L'g' || (**Fmt == L'G')))) {
        if (*Prefix == 4) {
          *Prefix = 2;
        }
        *Type = 7;
        pWVar1 = *Fmt;
        *Fmt = pWVar1 + 1;
        *(char *)Flags_local = (char)*pWVar1;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if (**Fmt == L'n') {
        if (*Prefix == 4) {
          *Prefix = 2;
        }
        if (*Prefix == 1) {
          *(undefined1 *)Flags_local = 0x68;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        pWVar1 = *Fmt;
        *Fmt = pWVar1 + 1;
        *(char *)Flags_local = (char)*pWVar1;
        *Type = 6;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if (**Fmt == L'p') {
        *Type = 5;
        *Fmt = *Fmt + 1;
        if (*Prefix == 3) {
          if (*Precision == -1) {
            *Precision = 0x10;
            *(undefined1 *)Flags_local = 0x2e;
            puVar4 = (undefined1 *)((long)Flags_local + 2);
            *(undefined1 *)((long)Flags_local + 1) = 0x31;
            Flags_local = (LPINT)((long)Flags_local + 3);
            *puVar4 = 0x36;
          }
          puVar4 = (undefined1 *)((long)Flags_local + 1);
          *(undefined1 *)Flags_local = 0x6c;
          Flags_local = (LPINT)((long)Flags_local + 2);
          *puVar4 = 0x6c;
        }
        else {
          if (*Precision == -1) {
            *Precision = 8;
            puVar4 = (undefined1 *)((long)Flags_local + 1);
            *(undefined1 *)Flags_local = 0x2e;
            Flags_local = (LPINT)((long)Flags_local + 2);
            *puVar4 = 0x38;
          }
          if (*Prefix == 4) {
            *Prefix = 2;
          }
        }
        *(undefined1 *)Flags_local = 0x58;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      *(undefined1 *)Flags_local = 0;
      CorUnix::InternalFree(__nptr);
      pthrCurrent_local._4_4_ = TempStr._4_4_;
    }
  }
  return pthrCurrent_local._4_4_;
}

Assistant:

BOOL Internal_ExtractFormatW(CPalThread *pthrCurrent, LPCWSTR *Fmt, LPSTR Out, LPINT Flags,
    LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = (CHAR) *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) InternalMalloc(PAL_wcslen(*Fmt)+1);
    if (!TempStr)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
            case '-':
                *Flags |= PFF_MINUS; break;
            case '+':
                *Flags |= PFF_PLUS; break;
            case '0':
                *Flags |= PFF_ZERO; break;
            case ' ':
                *Flags |= PFF_SPACE; break;
            case '#':
                *Flags |= PFF_POUND; break;
        }
            *Out++ = (CHAR) *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit(**Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit(**Fmt))
        {
            *TempStrPtr++ = (CHAR) **Fmt;
            *Out++ = (CHAR) *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            ERROR("atoi returned a negative value indicative of an overflow.\n");
            pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = (CHAR) *(*Fmt)++;
        if (isdigit(**Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit(**Fmt))
            {
                *Out++ = (CHAR) *(*Fmt)++;
            }
        }
    }

    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = (CHAR) *(*Fmt)++;
        if (isdigit(**Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit(**Fmt))
            {
                *TempStrPtr++ = (CHAR) **Fmt;
                *Out++ = (CHAR) *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                ERROR("atoi returned a negative value indicative of an overflow.\n");
                pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = (CHAR) *(*Fmt)++;
            if (isdigit(**Fmt))
            {
                /* this is an invalid precision because we have a .* then a number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit(**Fmt))
                {
                    *Out++ = (CHAR) *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    if ((*Fmt)[0] == 'I')
    {
        /* grab prefix of 'I64' for __int64 */
        if ((*Fmt)[1] == '6' && (*Fmt)[2] == '4')
        {
            /* convert to 'll' so that Unix snprintf can handle it */
            *Fmt += 3;
            *Prefix = PFF_PREFIX_LONGLONG;
        }
        /* grab prefix of 'I32' for __int32 */
        else if ((*Fmt)[1] == '3' && (*Fmt)[2] == '2')
        {
            *Fmt += 3;
        }
        else
        {
            ++(*Fmt);
    #ifdef BIT64
            /* convert to 'll' so that Unix snprintf can handle it */
            *Prefix = PFF_PREFIX_LONGLONG;
    #endif
        }
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
 #ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'C' || **Fmt == 'S')
#endif
        {
            *Prefix = PFF_PREFIX_LONG_W;
        }
        if (**Fmt == 'l')
        {
            *Prefix = PFF_PREFIX_LONGLONG;
            ++(*Fmt);
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }


    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'c')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG || *Prefix == PFF_PREFIX_LONG_W)
        {
            *Out++ = 'l';
            *Prefix = PFF_PREFIX_LONG;
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S' )
    {
        if ( **Fmt == 'S' )
        {
           *Type = PFF_TYPE_WSTRING;
        }
        else
        {
            *Type = PFF_TYPE_STRING;
        }
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 's')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }

        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG || *Prefix == PFF_PREFIX_LONG_W)
        {
            *Out++ = 'l';
            *Prefix = PFF_PREFIX_LONG;
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        if (*Prefix == PFF_PREFIX_LONG_W)
        {
            *Prefix = PFF_PREFIX_LONG;
        }

        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_LONG_W)
        {
            *Prefix = PFF_PREFIX_LONG;
        }

        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        (*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
                *Out++ = '.';
                *Out++ = '1';
                *Out++ = '6';
            }
            /* native *printf does not support %I64p
               (actually %llp), so we need to cheat a little bit */
            *Out++ = 'l';
            *Out++ = 'l';
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
                *Out++ = '.';
                *Out++ = '8';
            }
            if (*Prefix == PFF_PREFIX_LONG_W)
            {
                *Prefix = PFF_PREFIX_LONG;
            }
        }
        *Out++ = 'X';
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    InternalFree(TempStr);
    return Result;
}